

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc.c
# Opt level: O0

float vorbis_lpc_from_data(float *data,float *lpci,int n,int m)

{
  int iVar1;
  long lVar2;
  void *__s;
  double dVar3;
  undefined8 uStack_80;
  undefined8 uStack_78;
  double local_70;
  double damp;
  double g;
  double tmp;
  double r;
  double d;
  int j;
  int i;
  double epsilon;
  double error;
  double *lpc;
  double *aut;
  int m_local;
  int n_local;
  float *lpci_local;
  float *data_local;
  
  lpc = (double *)((long)&uStack_78 - ((long)m * 8 + 0x17U & 0xfffffffffffffff0));
  error = (double)((long)lpc - ((long)m * 8 + 0xfU & 0xfffffffffffffff0));
  d._0_4_ = m + 1;
  while (iVar1 = d._0_4_ + -1, d._0_4_ != 0) {
    r = 0.0;
    for (d._4_4_ = iVar1; (int)d._4_4_ < n; d._4_4_ = d._4_4_ + 1) {
      r = (double)data[(int)d._4_4_] * (double)data[(int)(d._4_4_ - iVar1)] + r;
    }
    lpc[iVar1] = r;
    d._0_4_ = iVar1;
  }
  epsilon = *lpc * 1.0000000001;
  _j = *lpc * 1e-09 + 1e-10;
  d._4_4_ = 0;
  d._0_4_ = iVar1;
  do {
    aut._0_4_ = m;
    _m_local = lpci;
    if (m <= (int)d._4_4_) {
LAB_009c66de:
      local_70 = 0.99;
      for (d._0_4_ = 0; d._0_4_ < (int)aut; d._0_4_ = d._0_4_ + 1) {
        *(double *)((long)error + (long)d._0_4_ * 8) =
             local_70 * *(double *)((long)error + (long)d._0_4_ * 8);
        local_70 = local_70 * 0.99;
      }
      for (d._0_4_ = 0; d._0_4_ < (int)aut; d._0_4_ = d._0_4_ + 1) {
        _m_local[d._0_4_] = (float)*(double *)((long)error + (long)d._0_4_ * 8);
      }
      return (float)epsilon;
    }
    tmp = -lpc[(int)(d._4_4_ + 1)];
    if (epsilon < _j) {
      __s = (void *)((long)error + (long)(int)d._4_4_ * 8);
      iVar1 = m - d._4_4_;
      aut._4_4_ = n;
      lpci_local = data;
      *(undefined8 *)((long)error + -8) = 0x9c657d;
      memset(__s,0,(long)iVar1 << 3);
      goto LAB_009c66de;
    }
    for (d._0_4_ = 0; d._0_4_ < (int)d._4_4_; d._0_4_ = d._0_4_ + 1) {
      tmp = tmp - *(double *)((long)error + (long)d._0_4_ * 8) * lpc[(int)(d._4_4_ - d._0_4_)];
    }
    dVar3 = tmp / epsilon;
    *(double *)((long)error + (long)(int)d._4_4_ * 8) = dVar3;
    for (d._0_4_ = 0; uStack_78._4_4_ = d._0_4_, d._0_4_ < (int)d._4_4_ / 2; d._0_4_ = d._0_4_ + 1)
    {
      g = *(double *)((long)error + (long)d._0_4_ * 8);
      *(double *)((long)error + (long)d._0_4_ * 8) =
           dVar3 * *(double *)((long)error + (long)(int)((d._4_4_ - 1) - d._0_4_) * 8) +
           *(double *)((long)error + (long)d._0_4_ * 8);
      lVar2 = (long)(int)((d._4_4_ - 1) - d._0_4_);
      *(double *)((long)error + lVar2 * 8) = dVar3 * g + *(double *)((long)error + lVar2 * 8);
    }
    if ((d._4_4_ & 1) != 0) {
      *(double *)((long)error + (long)d._0_4_ * 8) =
           *(double *)((long)error + (long)d._0_4_ * 8) * dVar3 +
           *(double *)((long)error + (long)d._0_4_ * 8);
    }
    epsilon = (1.0 - dVar3 * dVar3) * epsilon;
    d._4_4_ = d._4_4_ + 1;
  } while( true );
}

Assistant:

float vorbis_lpc_from_data(float *data,float *lpci,int n,int m){
  double *aut=alloca(sizeof(*aut)*(m+1));
  double *lpc=alloca(sizeof(*lpc)*(m));
  double error;
  double epsilon;
  int i,j;

  /* autocorrelation, p+1 lag coefficients */
  j=m+1;
  while(j--){
    double d=0; /* double needed for accumulator depth */
    for(i=j;i<n;i++)d+=(double)data[i]*data[(i-j)];
    aut[j]=d;
  }

  /* Generate lpc coefficients from autocorr values */

  /* set our noise floor to about -100dB */
  error=aut[0] * (1. + 1e-10);
  epsilon=1e-9*aut[0]+1e-10;

  for(i=0;i<m;i++){
    double r= -aut[i+1];

    if(error<epsilon){
      memset(lpc+i,0,(m-i)*sizeof(*lpc));
      goto done;
    }

    /* Sum up this iteration's reflection coefficient; note that in
       Vorbis we don't save it.  If anyone wants to recycle this code
       and needs reflection coefficients, save the results of 'r' from
       each iteration. */

    for(j=0;j<i;j++)r-=lpc[j]*aut[i-j];
    r/=error;

    /* Update LPC coefficients and total error */

    lpc[i]=r;
    for(j=0;j<i/2;j++){
      double tmp=lpc[j];

      lpc[j]+=r*lpc[i-1-j];
      lpc[i-1-j]+=r*tmp;
    }
    if(i&1)lpc[j]+=lpc[j]*r;

    error*=1.-r*r;

  }

 done:

  /* slightly damp the filter */
  {
    double g = .99;
    double damp = g;
    for(j=0;j<m;j++){
      lpc[j]*=damp;
      damp*=g;
    }
  }

  for(j=0;j<m;j++)lpci[j]=(float)lpc[j];

  /* we need the error value to know how big an impulse to hit the
     filter with later */

  return (float)error;
}